

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_xc_ksdt.c
# Opt level: O2

void lda_xc_ksdt_init(xc_func_type *p)

{
  int iVar1;
  void *__dest;
  lda_xc_ksdt_params *__src;
  
  __dest = malloc(0x130);
  p->params = __dest;
  iVar1 = p->info->number;
  if (iVar1 == 0x241) {
    __src = &par_gdsmfb;
  }
  else if (iVar1 == 0x13e) {
    __src = &par_corrksdt;
  }
  else {
    if (iVar1 != 0x103) {
      fwrite("Internal error in lda_xc_ksdt\n",0x1e,1,_stderr);
      exit(1);
    }
    __src = &par_ksdt;
  }
  memcpy(__dest,__src,0x130);
  return;
}

Assistant:

static void
lda_xc_ksdt_init(xc_func_type *p)
{
  lda_xc_ksdt_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(lda_xc_ksdt_params));
  params = (lda_xc_ksdt_params *)(p->params);

  switch(p->info->number){
  case XC_LDA_XC_KSDT:
    libxc_memcpy(params, &par_ksdt, sizeof(lda_xc_ksdt_params));
    break;
  case XC_LDA_XC_GDSMFB:
    libxc_memcpy(params, &par_gdsmfb, sizeof(lda_xc_ksdt_params));
    break;
  case XC_LDA_XC_CORRKSDT:
    libxc_memcpy(params, &par_corrksdt, sizeof(lda_xc_ksdt_params));
    break;
  default:
    fprintf(stderr, "Internal error in lda_xc_ksdt\n");
    exit(1);
  }
}